

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void google::protobuf::UninterpretedOption::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  _func_int **pp_Var2;
  ulong uVar3;
  Nullable<const_char_*> failure_msg;
  Arena *pAVar4;
  UninterpretedOption *_this;
  UninterpretedOption *local_28;
  MessageLite *local_20 [2];
  
  local_28 = (UninterpretedOption *)to_msg;
  local_20[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<google::protobuf::UninterpretedOption_const*,google::protobuf::UninterpretedOption*>
                          ((UninterpretedOption **)local_20,&local_28,"&from != _this");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x3337,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_20)
    ;
  }
  RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::MergeFrom
            (&(local_28->field_0)._impl_.name_,
             (RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart> *)
             &from_msg[1]._internal_metadata_);
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((uVar1 & 0x3f) != 0) {
    if ((uVar1 & 1) != 0) {
      pp_Var2 = from_msg[3]._vptr_MessageLite;
      (local_28->field_0)._impl_._has_bits_.has_bits_[0] =
           (local_28->field_0)._impl_._has_bits_.has_bits_[0] | 1;
      pAVar4 = (Arena *)(local_28->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar4 & 1) != 0) {
        pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                (&(local_28->field_0)._impl_.identifier_value_,
                 (string *)((ulong)pp_Var2 & 0xfffffffffffffffc),pAVar4);
    }
    if ((uVar1 & 2) != 0) {
      uVar3 = from_msg[3]._internal_metadata_.ptr_;
      (local_28->field_0)._impl_._has_bits_.has_bits_[0] =
           (local_28->field_0)._impl_._has_bits_.has_bits_[0] | 2;
      pAVar4 = (Arena *)(local_28->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar4 & 1) != 0) {
        pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                (&(local_28->field_0)._impl_.string_value_,(string *)(uVar3 & 0xfffffffffffffffc),
                 pAVar4);
    }
    if ((uVar1 & 4) != 0) {
      pp_Var2 = from_msg[4]._vptr_MessageLite;
      (local_28->field_0)._impl_._has_bits_.has_bits_[0] =
           (local_28->field_0)._impl_._has_bits_.has_bits_[0] | 4;
      pAVar4 = (Arena *)(local_28->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar4 & 1) != 0) {
        pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                (&(local_28->field_0)._impl_.aggregate_value_,
                 (string *)((ulong)pp_Var2 & 0xfffffffffffffffc),pAVar4);
    }
    if ((uVar1 & 8) != 0) {
      *(intptr_t *)((long)&local_28->field_0 + 0x38) = from_msg[4]._internal_metadata_.ptr_;
    }
    if ((uVar1 & 0x10) != 0) {
      *(_func_int ***)((long)&local_28->field_0 + 0x40) = from_msg[5]._vptr_MessageLite;
    }
    if ((uVar1 & 0x20) != 0) {
      *(intptr_t *)((long)&local_28->field_0 + 0x48) = from_msg[5]._internal_metadata_.ptr_;
    }
  }
  (local_28->field_0)._impl_._has_bits_.has_bits_[0] =
       (local_28->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(local_28->super_Message).super_MessageLite._internal_metadata_,
             &from_msg->_internal_metadata_);
  return;
}

Assistant:

void UninterpretedOption::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<UninterpretedOption*>(&to_msg);
  auto& from = static_cast<const UninterpretedOption&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.UninterpretedOption)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_name()->MergeFrom(
      from._internal_name());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_identifier_value(from._internal_identifier_value());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_string_value(from._internal_string_value());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_internal_set_aggregate_value(from._internal_aggregate_value());
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.positive_int_value_ = from._impl_.positive_int_value_;
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.negative_int_value_ = from._impl_.negative_int_value_;
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.double_value_ = from._impl_.double_value_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}